

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *list)

{
  undefined8 *puVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  void *pvVar4;
  long lVar5;
  size_t size;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range2;
  ulong uVar6;
  
  size = (long)(list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)size >> 3;
  if (*(ulong *)(this + 0x10) < uVar6) {
    *(ulong *)(this + 0x10) = uVar6;
    pvVar4 = MixedArena::allocSpace(*(MixedArena **)(this + 0x18),size,8);
    *(void **)this = pvVar4;
  }
  ppEVar2 = (list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar3 = (list->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar2 != ppEVar3) {
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)ppEVar2 + lVar5);
      *(undefined8 *)(*(long *)this + lVar5) = *puVar1;
      lVar5 = lVar5 + 8;
    } while ((pointer)(puVar1 + 1) != ppEVar3);
  }
  *(ulong *)(this + 8) = uVar6;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }